

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

bool __thiscall mpt::array::set(array *this,reference<mpt::buffer> *a)

{
  long lVar1;
  content *pcVar2;
  content *pcVar3;
  
  pcVar3 = *(content **)a;
  if (pcVar3 == (content *)0x0) {
    pcVar2 = (this->_buf)._ref;
    if (pcVar2 == (content *)0x0) {
      return true;
    }
    pcVar3 = (content *)0x0;
  }
  else {
    if (*(long *)(pcVar3 + 8) != 0) {
      return false;
    }
    if (pcVar3 == (this->_buf)._ref) {
      return true;
    }
    lVar1 = (**(code **)(*(long *)pcVar3 + 0x10))(pcVar3);
    if (lVar1 == 0) {
      pcVar3 = (content *)0x0;
    }
    pcVar2 = (this->_buf)._ref;
    if (pcVar2 == (content *)0x0) goto LAB_00128d12;
  }
  (**(code **)(*(long *)pcVar2 + 8))();
LAB_00128d12:
  (this->_buf)._ref = pcVar3;
  return true;
}

Assistant:

bool array::set(const reference<buffer> &a)
{
	buffer *b;
	if ((b = a.instance()) && b->content_traits()) {
		return false;
	}
	_buf = reinterpret_cast<const reference<content> &>(a);
	return true;
}